

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

bool goodform::json::parse_object(istream *input,any *v)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  *this;
  mapped_type *this_00;
  bool bVar4;
  any value;
  string key;
  
  key.field_2._8_8_ = &key._M_string_length;
  key._M_dataplus._M_p = (pointer)0x0;
  key._M_string_length = 0;
  key.field_2._M_allocated_capacity = 0;
  std::any::operator=(v,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                         *)&key);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
               *)&key);
  cVar1 = std::istream::get();
  if (cVar1 != '{') {
    return false;
  }
  bVar2 = false;
  do {
    bVar4 = false;
    while( true ) {
      if (bVar2) {
        return bVar2;
      }
      if (bVar4) {
        return bVar2;
      }
      if (*(int *)(input + *(long *)(*(long *)input + -0x18) + 0x20) != 0) {
        return false;
      }
      strip_white_space(input);
      iVar3 = std::istream::peek();
      if (iVar3 == 0x7d) break;
      key._M_dataplus._M_p = (pointer)&key.field_2;
      key._M_string_length = 0;
      key.field_2._M_allocated_capacity = key.field_2._M_allocated_capacity & 0xffffffffffffff00;
      bVar2 = read_string(input,&key);
      bVar4 = true;
      if (bVar2) {
        strip_white_space(input);
        iVar3 = std::istream::peek();
        if (iVar3 != 0x3a) goto LAB_001372ef;
        std::istream::seekg((long)input,_S_cur);
        strip_white_space(input);
        value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
        value._M_storage._M_ptr = (void *)0x0;
        bVar2 = deserialize(input,&value);
        this = std::
               any_cast<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>&>
                         (v);
        this_00 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                  ::operator[](this,&key);
        std::any::operator=(this_00,&value);
        bVar4 = true;
        if (bVar2) {
          strip_white_space(input);
          iVar3 = std::istream::peek();
          iVar3 = iVar3 << 0x18;
          if ((iVar3 != 0x7d000000) && (iVar3 != 0x2c000000)) goto LAB_001372f4;
          bVar2 = iVar3 == 0x7d000000;
          std::istream::seekg((long)input,_S_cur);
          bVar4 = false;
        }
        else {
LAB_001372f4:
          bVar2 = false;
        }
        std::any::reset(&value);
      }
      else {
LAB_001372ef:
        bVar2 = false;
      }
      std::__cxx11::string::~string((string *)&key);
    }
    std::istream::seekg((long)input,_S_cur);
    bVar2 = true;
  } while( true );
}

Assistant:

bool json::parse_object(std::istream& input, any& v)
  {
    v = object_t();
    char c = (char)input.get();
    bool closingBraceFound = false;
    if (c == '{')
    {
      bool parseError = false;
      while(!closingBraceFound && !parseError && input.good())
      {
        strip_white_space(input);
        if ((closingBraceFound = (input.peek() == '}')))
        {
          input.seekg(1, std::ios::cur);
        }
        else
        {
          std::string key;
          if (!(parseError = !read_string(input, key)))
          {
            strip_white_space(input);
            if (!(parseError = (input.peek() != ':')))
            {
              input.seekg(1, std::ios::cur);
              strip_white_space(input);

              any value;
              parseError = !deserialize(input, value);
              get<object_t>(v)[key] = std::move(value);

              if (!parseError)
              {
                strip_white_space(input);
                c = (char)input.peek();
                if ((closingBraceFound = (c == '}')) || !(parseError = (c != ',')))
                  input.seekg(1, std::ios::cur);
              }
            }
          }
        }
      }
    }
    return closingBraceFound;
  }